

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitStream.h
# Opt level: O3

void __thiscall BitStreamReader::skipBits(BitStreamReader *this,uint num)

{
  uint uVar1;
  undefined8 *puVar2;
  uint uVar3;
  uint *buff;
  
  uVar1 = (this->super_BitStream).m_totalBits;
  if (uVar1 < num) {
    puVar2 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar2 = &PTR__exception_0023ca88;
    __cxa_throw(puVar2,&BitStreamException::typeinfo,std::exception::~exception);
  }
  if (num < 0x21) {
    uVar3 = this->m_bitLeft - num;
    if (this->m_bitLeft < num) {
      buff = (this->super_BitStream).m_buffer + 1;
      (this->super_BitStream).m_buffer = buff;
      uVar1 = getCurVal(this,buff);
      this->m_curVal = uVar1;
      uVar1 = (this->super_BitStream).m_totalBits;
      uVar3 = (this->m_bitLeft - num) + 0x20;
    }
    this->m_bitLeft = uVar3;
    (this->super_BitStream).m_totalBits = uVar1 - num;
    return;
  }
  __assert_fail("num <= INT_BIT",
                "/workspace/llm4binary/github/license_c_cmakelists/justdan96[P]tsMuxer/tsMuxer/bitStream.h"
                ,0x78,"void BitStreamReader::skipBits(const unsigned int)");
}

Assistant:

void skipBits(const unsigned num)
    {
        if (m_totalBits < num)
            THROW_BITSTREAM_ERR;
        assert(num <= INT_BIT);
        if (num <= m_bitLeft)
            m_bitLeft -= num;
        else
        {
            m_buffer++;
            m_curVal = getCurVal(m_buffer);
            m_bitLeft += INT_BIT - num;
        }
        m_totalBits -= num;
    }